

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O2

void __thiscall
t_php_generator::generate_reflection_setters
          (t_php_generator *this,ostringstream *out,string *field_name,string *cap_name)

{
  int *piVar1;
  ostream *poVar2;
  string sStack_68;
  string local_48;
  
  t_generator::indent_abi_cxx11_(&sStack_68,(t_generator *)this);
  poVar2 = std::operator<<(&out->super_basic_ostream<char,_std::char_traits<char>_>,
                           (string *)&sStack_68);
  poVar2 = std::operator<<(poVar2,"public function set");
  poVar2 = std::operator<<(poVar2,(string *)cap_name);
  poVar2 = std::operator<<(poVar2,"(");
  poVar2 = std::operator<<(poVar2,"$");
  poVar2 = std::operator<<(poVar2,(string *)field_name);
  poVar2 = std::operator<<(poVar2,")");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_48,(t_generator *)this);
  poVar2 = std::operator<<(poVar2,(string *)&local_48);
  poVar2 = std::operator<<(poVar2,"{");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&sStack_68);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&sStack_68,(t_generator *)this);
  poVar2 = std::operator<<(&out->super_basic_ostream<char,_std::char_traits<char>_>,
                           (string *)&sStack_68);
  poVar2 = std::operator<<(poVar2,"$this->");
  poVar2 = std::operator<<(poVar2,(string *)field_name);
  poVar2 = std::operator<<(poVar2," = $");
  poVar2 = std::operator<<(poVar2,(string *)field_name);
  poVar2 = std::operator<<(poVar2,";");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&sStack_68);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&sStack_68,(t_generator *)this);
  poVar2 = std::operator<<(&out->super_basic_ostream<char,_std::char_traits<char>_>,
                           (string *)&sStack_68);
  poVar2 = std::operator<<(poVar2,"}");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&sStack_68);
  std::operator<<(&out->super_basic_ostream<char,_std::char_traits<char>_>,
                  (string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_php_generator::generate_reflection_setters(ostringstream& out,
						  string field_name,
						  string cap_name) {

  out << indent() << "public function set" << cap_name << "(" << "$" << field_name << ")" << endl
      << indent() << "{" << endl;

  indent_up();

  out << indent() << "$this->" << field_name << " = $" << field_name << ";" << endl;


  indent_down();
  out << indent() << "}" << endl;
  out << endl;
}